

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O1

block_state deflate_rle(deflate_state *s,int flush)

{
  long lVar1;
  Bytef BVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  byte bVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  Bytef *pBVar10;
  long lVar11;
  bool bVar12;
  
  do {
    if (s->lookahead < 0x103) {
      fill_window(s);
      if (flush == 0 && s->lookahead < 0x103) {
        return need_more;
      }
      if (s->lookahead == 0) {
        s->insert = 0;
        if (flush == 4) {
          uVar7 = s->block_start;
          if ((long)uVar7 < 0) {
            pBVar10 = (Bytef *)0x0;
          }
          else {
            pBVar10 = s->window + (uVar7 & 0xffffffff);
          }
          cm_zlib__tr_flush_block(s,(charf *)pBVar10,s->strstart - uVar7,1);
          s->block_start = (ulong)s->strstart;
          flush_pending(s->strm);
          return finish_done - (s->strm->avail_out == 0);
        }
        if (s->sym_next != 0) {
          uVar7 = s->block_start;
          if ((long)uVar7 < 0) {
            pBVar10 = (Bytef *)0x0;
          }
          else {
            pBVar10 = s->window + (uVar7 & 0xffffffff);
          }
          cm_zlib__tr_flush_block(s,(charf *)pBVar10,s->strstart - uVar7,0);
          s->block_start = (ulong)s->strstart;
          flush_pending(s->strm);
          if (s->strm->avail_out == 0) {
            return need_more;
          }
        }
        return block_done;
      }
    }
    s->match_length = 0;
    uVar3 = s->lookahead;
    if ((2 < uVar3) && (uVar7 = (ulong)s->strstart, uVar7 != 0)) {
      pBVar10 = s->window;
      BVar2 = pBVar10[uVar7 - 1];
      if ((BVar2 == pBVar10[uVar7]) &&
         ((pBVar10 = pBVar10 + uVar7, BVar2 == pBVar10[1] && (BVar2 == pBVar10[2])))) {
        iVar4 = (int)pBVar10;
        lVar11 = 0;
        do {
          iVar8 = (int)lVar11;
          if (BVar2 != pBVar10[lVar11 + 3]) {
            iVar8 = iVar4 + iVar8 + 3;
            goto LAB_0023f9c9;
          }
          if (BVar2 != pBVar10[lVar11 + 4]) {
            iVar8 = iVar4 + iVar8 + 4;
            goto LAB_0023f9c9;
          }
          if (BVar2 != pBVar10[lVar11 + 5]) {
            iVar8 = iVar4 + iVar8 + 5;
            goto LAB_0023f9c9;
          }
          if (BVar2 != pBVar10[lVar11 + 6]) {
            iVar8 = iVar4 + iVar8 + 6;
            goto LAB_0023f9c9;
          }
          if (BVar2 != pBVar10[lVar11 + 7]) {
            iVar8 = iVar4 + iVar8 + 7;
            goto LAB_0023f9c9;
          }
          if (BVar2 != pBVar10[lVar11 + 8]) {
            iVar8 = iVar4 + iVar8 + 8;
            goto LAB_0023f9c9;
          }
          if (BVar2 != pBVar10[lVar11 + 9]) {
            iVar8 = iVar4 + iVar8 + 9;
            goto LAB_0023f9c9;
          }
          lVar1 = lVar11 + 8;
        } while ((lVar11 + 2U < 0xfa) &&
                (lVar5 = lVar11 + 10, lVar11 = lVar1, BVar2 == pBVar10[lVar5]));
        iVar8 = iVar4 + (int)lVar1 + 2;
LAB_0023f9c9:
        uVar9 = (iVar8 - (iVar4 + 0x102)) + 0x102;
        if (uVar3 <= uVar9) {
          uVar9 = uVar3;
        }
        s->match_length = uVar9;
      }
    }
    if (s->match_length < 3) {
      bVar6 = s->window[s->strstart];
      uVar3 = s->sym_next;
      s->sym_next = uVar3 + 1;
      s->sym_buf[uVar3] = '\0';
      uVar3 = s->sym_next;
      s->sym_next = uVar3 + 1;
      s->sym_buf[uVar3] = '\0';
      uVar3 = s->sym_next;
      s->sym_next = uVar3 + 1;
      s->sym_buf[uVar3] = bVar6;
      s->dyn_ltree[bVar6].fc.freq = s->dyn_ltree[bVar6].fc.freq + 1;
      bVar12 = s->sym_next == s->sym_end;
      s->lookahead = s->lookahead - 1;
      s->strstart = s->strstart + 1;
    }
    else {
      bVar6 = (char)s->match_length - 3;
      uVar3 = s->sym_next;
      s->sym_next = uVar3 + 1;
      s->sym_buf[uVar3] = '\x01';
      uVar3 = s->sym_next;
      s->sym_next = uVar3 + 1;
      s->sym_buf[uVar3] = '\0';
      uVar3 = s->sym_next;
      s->sym_next = uVar3 + 1;
      s->sym_buf[uVar3] = bVar6;
      s->dyn_ltree[(ulong)""[bVar6] + 0x101].fc.freq =
           s->dyn_ltree[(ulong)""[bVar6] + 0x101].fc.freq + 1;
      s->dyn_dtree[0].fc.freq = s->dyn_dtree[0].fc.freq + 1;
      bVar12 = s->sym_next == s->sym_end;
      s->lookahead = s->lookahead - s->match_length;
      s->strstart = s->strstart + s->match_length;
      s->match_length = 0;
    }
    if (bVar12) {
      uVar7 = s->block_start;
      if ((long)uVar7 < 0) {
        pBVar10 = (Bytef *)0x0;
      }
      else {
        pBVar10 = s->window + (uVar7 & 0xffffffff);
      }
      cm_zlib__tr_flush_block(s,(charf *)pBVar10,s->strstart - uVar7,0);
      s->block_start = (ulong)s->strstart;
      flush_pending(s->strm);
      if (s->strm->avail_out == 0) {
        return need_more;
      }
    }
  } while( true );
}

Assistant:

local block_state deflate_rle(deflate_state *s, int flush) {
    int bflush;             /* set if current block must be flushed */
    uInt prev;              /* byte at distance one to match */
    Bytef *scan, *strend;   /* scan goes up to strend for length of run */

    for (;;) {
        /* Make sure that we always have enough lookahead, except
         * at the end of the input file. We need MAX_MATCH bytes
         * for the longest run, plus one for the unrolled loop.
         */
        if (s->lookahead <= MAX_MATCH) {
            fill_window(s);
            if (s->lookahead <= MAX_MATCH && flush == Z_NO_FLUSH) {
                return need_more;
            }
            if (s->lookahead == 0) break; /* flush the current block */
        }

        /* See how many times the previous byte repeats */
        s->match_length = 0;
        if (s->lookahead >= MIN_MATCH && s->strstart > 0) {
            scan = s->window + s->strstart - 1;
            prev = *scan;
            if (prev == *++scan && prev == *++scan && prev == *++scan) {
                strend = s->window + s->strstart + MAX_MATCH;
                do {
                } while (prev == *++scan && prev == *++scan &&
                         prev == *++scan && prev == *++scan &&
                         prev == *++scan && prev == *++scan &&
                         prev == *++scan && prev == *++scan &&
                         scan < strend);
                s->match_length = MAX_MATCH - (uInt)(strend - scan);
                if (s->match_length > s->lookahead)
                    s->match_length = s->lookahead;
            }
            Assert(scan <= s->window + (uInt)(s->window_size - 1),
                   "wild scan");
        }

        /* Emit match if have run of MIN_MATCH or longer, else emit literal */
        if (s->match_length >= MIN_MATCH) {
            check_match(s, s->strstart, s->strstart - 1, s->match_length);

            _tr_tally_dist(s, 1, s->match_length - MIN_MATCH, bflush);

            s->lookahead -= s->match_length;
            s->strstart += s->match_length;
            s->match_length = 0;
        } else {
            /* No match, output a literal byte */
            Tracevv((stderr,"%c", s->window[s->strstart]));
            _tr_tally_lit(s, s->window[s->strstart], bflush);
            s->lookahead--;
            s->strstart++;
        }
        if (bflush) FLUSH_BLOCK(s, 0);
    }
    s->insert = 0;
    if (flush == Z_FINISH) {
        FLUSH_BLOCK(s, 1);
        return finish_done;
    }
    if (s->sym_next)
        FLUSH_BLOCK(s, 0);
    return block_done;
}